

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_sparse.cpp
# Opt level: O2

Matrix_Sparse * __thiscall Disa::Matrix_Sparse::operator*=(Matrix_Sparse *this,Matrix_Sparse *other)

{
  source_location *psVar1;
  pointer puVar2;
  pointer puVar3;
  size_type *i_column;
  bool bVar4;
  Scalar *pSVar5;
  ostream *poVar6;
  source_location *location;
  size_t sVar7;
  unsigned_long uVar8;
  size_t *i_row;
  const_iterator cVar9;
  iterator local_228;
  const_iterator local_208;
  iterator __begin1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  Matrix_Sparse *local_1a0;
  undefined1 local_198 [40];
  iterator __end1;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  undefined **local_90;
  Matrix_Sparse copy;
  
  psVar1 = (source_location *)
           (other->row_non_zero).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  location = (source_location *)
             (other->row_non_zero).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
             ._M_impl.super__Vector_impl_data._M_start;
  sVar7 = 0;
  if (psVar1 != location) {
    sVar7 = ((long)psVar1 - (long)location >> 3) - 1;
  }
  if (this->column_size == sVar7) {
    copy.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    copy.column_size = 0;
    copy.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    copy.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    copy.column_index.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    copy.column_index.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    copy.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    copy.column_index.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    copy.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    copy.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    puVar2 = (this->row_non_zero).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    puVar3 = (this->row_non_zero).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_198._0_8_ = (Matrix_Sparse *)(((long)puVar2 - (long)puVar3 >> 3) + -1);
    if (puVar2 == puVar3) {
      local_198._0_8_ = (Matrix_Sparse *)0x0;
    }
    local_228.column_index =
         (size_type *)
         (((long)(other->column_index).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(other->column_index).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3) +
         ((long)(this->column_index).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->column_index).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start >> 3));
    reserve(&copy,(size_t *)local_198,(size_t *)&local_228);
    puVar2 = (this->row_non_zero).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    puVar3 = (this->row_non_zero).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_198._0_8_ = (Matrix_Sparse *)(((long)puVar2 - (long)puVar3 >> 3) + -1);
    if (puVar2 == puVar3) {
      local_198._0_8_ = (Matrix_Sparse *)0x0;
    }
    local_228.column_index = (size_type *)other->column_size;
    resize(&copy,(size_t *)local_198,(size_t *)&local_228);
    std::swap<Disa::Matrix_Sparse>(this,&copy);
    begin((Matrix_Sparse *)&__begin1);
    end((Matrix_Sparse *)&__end1);
    for (; (__begin1.matrix_row.matrix != __end1.matrix_row.matrix ||
           (__begin1.matrix_row.row_index != __end1.matrix_row.row_index));
        __begin1.matrix_row.row_index = __begin1.matrix_row.row_index + 1) {
      Matrix_Sparse_Row<Disa::Matrix_Sparse>::begin(&local_228,&__begin1.matrix_row);
      while( true ) {
        Matrix_Sparse_Row<Disa::Matrix_Sparse>::end((iterator *)local_198,&__begin1.matrix_row);
        bVar4 = Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>::operator!=
                          (&local_228,
                           (Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *)local_198);
        if (!bVar4) break;
        cVar9 = begin(other);
        local_198._0_8_ = cVar9.matrix_row.matrix;
        local_198._8_8_ = cVar9.matrix_row.row_index + *local_228.column_index;
        Matrix_Sparse_Row<const_Disa::Matrix_Sparse>::begin
                  (&local_208,(Matrix_Sparse_Row<const_Disa::Matrix_Sparse> *)local_198);
        while( true ) {
          cVar9 = begin(other);
          local_1c0._M_dataplus._M_p = (pointer)cVar9.matrix_row.matrix;
          local_1c0._M_string_length = cVar9.matrix_row.row_index + *local_228.column_index;
          Matrix_Sparse_Row<const_Disa::Matrix_Sparse>::end
                    ((const_iterator *)local_198,
                     (Matrix_Sparse_Row<const_Disa::Matrix_Sparse> *)&local_1c0);
          bVar4 = Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse>::operator!=
                            (&local_208,
                             (Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse> *)local_198)
          ;
          i_column = local_208.column_index;
          if (!bVar4) break;
          local_1c0._M_dataplus._M_p = (pointer)(*local_228.value * *local_208.value);
          bVar4 = contains(this,&local_228.row_index,local_208.column_index);
          if (bVar4) {
            local_1a0 = (Matrix_Sparse *)local_1c0._M_dataplus._M_p;
            operator[]((Matrix_Sparse *)local_198,(size_t *)this);
            pSVar5 = Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                               ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_198,i_column);
            *pSVar5 = (double)local_1a0 + *pSVar5;
          }
          else {
            insert((pair<Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>,_bool> *)
                   local_198,this,&local_228.row_index,i_column,(double *)&local_1c0);
          }
          local_208.column_index = local_208.column_index + 1;
          local_208.value = local_208.value + 1;
        }
        local_228.column_index = local_228.column_index + 1;
        local_228.value = local_228.value + 1;
      }
    }
    shrink_to_fit(this);
    ~Matrix_Sparse(&copy);
    return this;
  }
  poVar6 = std::operator<<((ostream *)&std::cerr,"\n");
  local_90 = &PTR_s__workspace_llm4binary_github_lic_00150d78;
  console_format_abi_cxx11_
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&copy,(Disa *)0x0,
             (Log_Level)&local_90,location);
  poVar6 = std::operator<<(poVar6,(string *)&copy);
  puVar2 = (this->row_non_zero).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  puVar3 = (this->row_non_zero).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar8 = 0;
  if (puVar2 != puVar3) {
    uVar8 = ((long)puVar2 - (long)puVar3 >> 3) - 1;
  }
  std::__cxx11::to_string(&local_f0,uVar8);
  std::operator+(&local_d0,"Incompatible other dimensions, ",&local_f0);
  std::operator+(&local_b0,&local_d0,",");
  std::__cxx11::to_string(&local_110,this->column_size);
  std::operator+(&local_1c0,&local_b0,&local_110);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__end1,
                 &local_1c0," vs. ");
  puVar2 = (other->row_non_zero).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  puVar3 = (other->row_non_zero).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar8 = 0;
  if (puVar2 != puVar3) {
    uVar8 = ((long)puVar2 - (long)puVar3 >> 3) - 1;
  }
  std::__cxx11::to_string(&local_130,uVar8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__begin1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__end1,
                 &local_130);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_208,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__begin1,",")
  ;
  std::__cxx11::to_string(&local_150,other->column_size);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_228,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_208,
                 &local_150);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_228,"."
                );
  poVar6 = std::operator<<(poVar6,(string *)local_198);
  std::endl<char,std::char_traits<char>>(poVar6);
  std::__cxx11::string::~string((string *)local_198);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&__begin1);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&__end1);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&copy);
  exit(1);
}

Assistant:

Matrix_Sparse& Matrix_Sparse::operator*=(const Matrix_Sparse& other) {
  ASSERT_DEBUG(column_size == other.size_row(),
               "Incompatible other dimensions, " + std::to_string(size_row()) + "," + std::to_string(size_column()) +
               " vs. " + std::to_string(other.size_row()) + "," + std::to_string(other.size_column()) + ".");
  Matrix_Sparse copy;
  copy.reserve(size_row(), size_non_zero() + other.size_non_zero());
  copy.resize(size_row(), other.size_column());
  std::swap(*this, copy);
  FOR_EACH_REF(iter_row, copy) {
    FOR_ITER_REF(iter_element, iter_row) {
      FOR_ITER(iter_element_other, *(other.begin() + iter_element.i_column())) {
        const std::size_t& i_row = iter_element.i_row();
        const std::size_t& i_column = iter_element_other.i_column();
        const Scalar& value = (*iter_element) * (*iter_element_other);
        if(!contains(i_row, i_column)) insert(i_row, i_column, value);
        else (*this)[i_row][i_column] += value;
      }
    }
  }
  shrink_to_fit();
  return *this;
}